

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_decode_long_field_Test::
PriceUpdateDecoderTest_test_decode_long_field_Test
          (PriceUpdateDecoderTest_test_decode_long_field_Test *this)

{
  PriceUpdateDecoderTest::PriceUpdateDecoderTest(&this->super_PriceUpdateDecoderTest);
  (this->super_PriceUpdateDecoderTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PriceUpdateDecoderTest_00271f10;
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_decode_long_field)
{
    int64_t value = 483948038L;
    buffer.WriteLong(value);
    FieldDef field_def = FieldDef(1, FieldTypeEnum::LONG, "field");
    PriceField field = PriceUpdateDecoder::DecodeField(buffer, field_def);
    EXPECT_EQ(PriceField::LONG, field.GetType());
    EXPECT_EQ(value, field.GetLong());
}